

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O3

callback_t *
multi_line_documentation_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  char cVar1;
  int iVar2;
  code *pcVar3;
  string comment;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  while( true ) {
    iVar2 = std::istream::peek();
    if (iVar2 == -1) break;
    cVar1 = std::istream::get();
    if (cVar1 == '*') {
      iVar2 = std::istream::peek();
      if (iVar2 == 0x2f) goto LAB_00106157;
    }
    std::__cxx11::string::push_back((char)&local_48);
  }
  std::__cxx11::string::_M_assign((string *)(anonymous_namespace)::last_comment_abi_cxx11_);
LAB_00106157:
  if ((anonymous_namespace)::current_class == 0) {
    pcVar3 = initial_state;
  }
  else {
    pcVar3 = class_state;
  }
  if ((anonymous_namespace)::current_property != 0) {
    pcVar3 = property_state;
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar3;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t multi_line_documentation_state(MetaConfiguration &conf,
                                          std::ifstream &f, int &error) {
  std::string comment;
  char c;
  while (f.peek() != EOF) {
    c = f.get();
    if (c == '*' && f.peek() == '/') {
      goto exit;
    }
    comment += c;
  }
  last_comment = comment;

exit:
  return current_property ? property_state
                          : current_class ? class_state : initial_state;
}